

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::resetOnNewSessionFixture::resetOnNewSessionFixture
          (resetOnNewSessionFixture *this)

{
  UtcTimeOnly *this_00;
  UtcTimeOnly *this_01;
  resetOnNewSessionFixture *this_local;
  
  acceptorFixture::acceptorFixture(&this->super_acceptorFixture);
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__resetOnNewSessionFixture_00461038;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application = (_func_int **)&PTR__resetOnNewSessionFixture_00461090;
  FIX::UtcTimeOnly::setCurrent
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime);
  this_00 = &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime;
  this_01 = &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime;
  FIX::UtcTimeOnly::operator=(this_01,this_00);
  FIX::DateTime::operator+=(&this_01->super_DateTime,2);
  FIX::DateTime::operator+=(&this_00->super_DateTime,-2);
  sessionFixture::createSession((sessionFixture *)this,0,-1,-1);
  return;
}

Assistant:

resetOnNewSessionFixture()
  {
    startTime.setCurrent();
    endTime = startTime;
    endTime += 2;
    startTime += -2;

    acceptorFixture::createSession( 0 );
  }